

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O2

ARKodeSPRKTable arkodeSymplecticMcLachlan2(void)

{
  sunrealtype *psVar1;
  ARKodeSPRKTable pAVar2;
  
  pAVar2 = ARKodeSPRKTable_Alloc(2);
  if (pAVar2 != (ARKodeSPRKTable)0x0) {
    pAVar2->q = 2;
    pAVar2->stages = 2;
    psVar1 = pAVar2->a;
    *psVar1 = 0.7071067811865476;
    psVar1[1] = 0.2928932188134524;
    psVar1 = pAVar2->ahat;
    *psVar1 = 0.29289321881345254;
    psVar1[1] = 0.7071067811865475;
  }
  return pAVar2;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticMcLachlan2(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(2);
  if (!sprk_table) { return NULL; }
  sprk_table->q      = 2;
  sprk_table->stages = 2;
  sprk_table->a[1]   = SUN_RCONST(1.0) - (SUN_RCONST(1.0) / SUN_RCONST(2.0)) *
                                         SUNRsqrt(SUN_RCONST(2.0));
  sprk_table->a[0]    = SUN_RCONST(1.0) - sprk_table->a[1];
  sprk_table->ahat[1] = SUN_RCONST(1.0) /
                        (SUN_RCONST(2.0) * (SUN_RCONST(1.0) - sprk_table->a[1]));
  sprk_table->ahat[0] = SUN_RCONST(1.0) - sprk_table->ahat[1];
  return sprk_table;
}